

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

void deflate_flush_block(libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
                        u32 block_length,deflate_sequence *sequences,_Bool is_final_block)

{
  byte *pbVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  undefined4 uVar5;
  u32 uVar6;
  u8 *puVar7;
  bool bVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  uint3 uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  long lVar20;
  byte bVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  size_t __n;
  ulong uVar26;
  uint uVar27;
  deflate_codes *pdVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 *puVar31;
  uint uVar32;
  ushort *puVar33;
  ulong *puVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  
  uVar26 = os->bitbuf;
  uVar35 = os->bitcount;
  puVar34 = (ulong *)os->next;
  puVar7 = os->end;
  lVar20 = (long)puVar7 - (long)puVar34;
  lVar24 = 7;
  if (lVar20 < 7) {
    lVar24 = lVar20;
  }
  deflate_precompute_huffman_header(c);
  uVar36 = (c->o).precode.num_explicit_lens;
  iVar22 = uVar36 * 3 + 0x11;
  lVar20 = 0;
  do {
    iVar22 = iVar22 + ((uint)*(byte *)((long)&c->o + lVar20 + 0x98) + (uint)""[lVar20]) *
                      *(int *)((long)&c->o + lVar20 * 4);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x13);
  puVar2 = (ulong *)(puVar7 + -lVar24);
  iVar41 = 0;
  iVar42 = 0;
  iVar43 = 0;
  iVar37 = 3;
  iVar38 = 0;
  iVar39 = 0;
  iVar40 = 0;
  lVar24 = 0;
  do {
    auVar3 = *(undefined1 (*) [16])((c->freqs).litlen + lVar24);
    uVar5 = *(undefined4 *)((c->codes).lens.litlen + lVar24);
    uVar25 = (ulong)(ushort)uVar5 & 0xffffffffffff00ff;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar25;
    auVar9[0xc] = (char)((uint)uVar5 >> 0x18);
    auVar10[8] = (char)((uint)uVar5 >> 0x10);
    auVar10._0_8_ = uVar25;
    auVar10[9] = 0;
    auVar10._10_3_ = auVar9._10_3_;
    auVar16._5_8_ = 0;
    auVar16._0_5_ = auVar10._8_5_;
    auVar11[4] = (char)((uint)uVar5 >> 8);
    auVar11._0_4_ = (int)uVar25;
    auVar11[5] = 0;
    auVar11._6_7_ = SUB137(auVar16 << 0x40,6);
    uVar12 = auVar9._10_3_ >> 0x10;
    auVar17._12_3_ = uVar12;
    auVar17._0_12_ = ZEXT312(uVar12) << 0x40;
    iVar22 = iVar22 + auVar3._0_4_ * (int)uVar25;
    iVar41 = iVar41 + auVar11._4_4_ * auVar3._4_4_;
    iVar42 = iVar42 + (int)((auVar3._8_8_ & 0xffffffff) * ((ulong)auVar10._8_5_ & 0xffffffff));
    iVar43 = iVar43 + (int)(((ulong)auVar17._8_7_ & 0xffffffff) * (ulong)auVar3._12_4_);
    iVar37 = iVar37 + auVar3._0_4_ * 8;
    iVar38 = iVar38 + auVar3._4_4_ * 8;
    iVar39 = iVar39 + auVar3._8_4_ * 8;
    iVar40 = iVar40 + auVar3._12_4_ * 8;
    lVar24 = lVar24 + 4;
  } while (lVar24 != 0x90);
  iVar22 = iVar43 + iVar41 + iVar42 + iVar22;
  iVar40 = iVar40 + iVar38 + iVar39 + iVar37;
  puVar7 = block_begin + block_length;
  iVar37 = 0;
  iVar38 = 0;
  iVar39 = 0;
  iVar41 = 0;
  iVar42 = 0;
  iVar43 = 0;
  lVar24 = -0x70;
  do {
    auVar3 = *(undefined1 (*) [16])((c->freqs).offset + lVar24 + -0x20);
    uVar5 = *(undefined4 *)((c->codes).lens.offset + lVar24 + -0x20);
    uVar25 = (ulong)(ushort)uVar5 & 0xffffffffffff00ff;
    auVar13._8_4_ = 0;
    auVar13._0_8_ = uVar25;
    auVar13[0xc] = (char)((uint)uVar5 >> 0x18);
    auVar14[8] = (char)((uint)uVar5 >> 0x10);
    auVar14._0_8_ = uVar25;
    auVar14[9] = 0;
    auVar14._10_3_ = auVar13._10_3_;
    auVar18._5_8_ = 0;
    auVar18._0_5_ = auVar14._8_5_;
    auVar15[4] = (char)((uint)uVar5 >> 8);
    auVar15._0_4_ = (int)uVar25;
    auVar15[5] = 0;
    auVar15._6_7_ = SUB137(auVar18 << 0x40,6);
    iVar44 = auVar3._4_4_;
    uVar23 = auVar3._12_4_;
    uVar12 = auVar13._10_3_ >> 0x10;
    auVar19._12_3_ = uVar12;
    auVar19._0_12_ = ZEXT312(uVar12) << 0x40;
    iVar22 = iVar22 + auVar3._0_4_ * (int)uVar25;
    iVar37 = iVar37 + auVar15._4_4_ * iVar44;
    iVar38 = iVar38 + (int)((auVar3._8_8_ & 0xffffffff) * ((ulong)auVar14._8_5_ & 0xffffffff));
    iVar39 = iVar39 + (int)(((ulong)auVar19._8_7_ & 0xffffffff) * (ulong)uVar23);
    iVar40 = iVar40 + auVar3._0_4_ * 9;
    iVar42 = iVar42 + auVar3._8_4_ * 9;
    iVar41 = iVar44 * 8 + iVar41 + iVar44;
    iVar43 = uVar23 * 8 + iVar43 + uVar23;
    lVar24 = lVar24 + 4;
  } while (lVar24 != 0);
  uVar27 = (uint)(c->codes).lens.litlen[0x100] + iVar39 + iVar37 + iVar38 + iVar22;
  uVar23 = iVar43 + iVar41 + iVar42 + iVar40 + 7;
  lVar24 = 0;
  do {
    uVar6 = (c->freqs).offset[lVar24 + -0x1f];
    uVar27 = uVar27 + ((uint)(c->codes).lens.offset[lVar24 + -0x1f] + (uint)""[lVar24]) * uVar6;
    uVar23 = uVar23 + ((uint)(c->static_codes).lens.offset[lVar24 + -0x1f] + (uint)""[lVar24]) *
                      uVar6;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x1d);
  lVar24 = 0;
  do {
    uVar6 = (c->freqs).offset[lVar24];
    uVar27 = uVar27 + ((uint)(c->codes).lens.offset[lVar24] + (uint)""[lVar24]) * uVar6;
    uVar23 = uVar23 + (""[lVar24] + 5) * uVar6;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x1e);
  uVar32 = (((block_length + 0xfffe) / 0xffff) * 0x28 + block_length * 8 + (5 - uVar35 & 7)) - 5;
  uVar29 = uVar32;
  if (uVar23 < uVar32) {
    uVar29 = uVar23;
  }
  if (uVar27 < uVar29) {
    uVar29 = uVar27;
  }
  if ((long)os->end - (long)puVar34 < (long)(ulong)(uVar29 + uVar35 + 7 >> 3)) {
    os->overflow = true;
  }
  else {
    if (uVar29 == uVar32) {
      do {
        __n = (long)puVar7 - (long)block_begin;
        bVar8 = (long)__n < 0x10000;
        if (0xffff < (long)__n) {
          __n = 0xffff;
        }
        *(byte *)puVar34 = (byte)uVar26 | (bVar8 && is_final_block) << ((byte)uVar35 & 0x1f);
        if (uVar35 < 6) {
          puVar33 = (ushort *)((long)puVar34 + 1);
        }
        else {
          *(undefined1 *)((long)puVar34 + 1) = 0;
          puVar33 = (ushort *)((long)puVar34 + 2);
        }
        *puVar33 = (ushort)__n;
        puVar33[1] = ~(ushort)__n;
        memcpy(puVar33 + 2,block_begin,__n);
        puVar34 = (ulong *)((long)puVar33 + __n + 4);
        block_begin = block_begin + __n;
        uVar35 = 0;
        uVar26 = 0;
        uVar25 = 0;
      } while (block_begin != puVar7);
    }
    else {
      bVar21 = (byte)uVar35;
      if (uVar29 == uVar23) {
        pdVar28 = &c->static_codes;
        uVar26 = (ulong)is_final_block << (bVar21 & 0x3f) | 1L << ((ulong)(uVar35 + 1) & 0x3f) |
                 uVar26;
        uVar35 = uVar35 + 3;
        if (puVar34 < puVar2) {
          *puVar34 = uVar26;
          uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
          puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
          uVar35 = uVar35 & 7;
        }
        else {
          for (; 7 < uVar35; uVar35 = uVar35 - 8) {
            *(char *)puVar34 = (char)uVar26;
            puVar34 = (ulong *)((long)puVar34 + 1);
            uVar26 = uVar26 >> 8;
          }
        }
      }
      else {
        uVar23 = (c->o).precode.num_items;
        uVar26 = (ulong)(c->o).precode.lens[0x10] << (bVar21 + 0x11 & 0x3f) |
                 (ulong)((c->o).precode.num_offset_syms - 1) << (bVar21 + 8 & 0x3f) |
                 (ulong)(uVar36 - 4) << (bVar21 + 0xd & 0x3f) |
                 2L << (bVar21 + 1 & 0x3f) | (ulong)is_final_block << (bVar21 & 0x3f) |
                 (ulong)((c->o).precode.num_litlen_syms - 0x101) << (bVar21 + 3 & 0x3f) | uVar26;
        uVar35 = uVar35 + 0x14;
        if (puVar34 < puVar2) {
          *puVar34 = uVar26;
          uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
          puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
          uVar35 = uVar35 & 7;
        }
        else {
          for (; 7 < uVar35; uVar35 = uVar35 - 8) {
            *(char *)puVar34 = (char)uVar26;
            puVar34 = (ulong *)((long)puVar34 + 1);
            uVar26 = uVar26 >> 8;
          }
        }
        pdVar28 = &c->codes;
        uVar25 = 2;
        if (2 < uVar36) {
          uVar25 = (ulong)uVar36;
        }
        uVar30 = 1;
        do {
          uVar26 = uVar26 | (ulong)*(byte *)((long)&c->o + (ulong)"\x10\x11\x12"[uVar30] + 0x98) <<
                            ((byte)uVar35 & 0x3f);
          uVar35 = uVar35 + 3;
          uVar30 = uVar30 + 1;
        } while (uVar25 != uVar30);
        if (puVar34 < puVar2) {
          *puVar34 = uVar26;
          uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
          puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
          uVar35 = uVar35 & 7;
        }
        else {
          for (; 7 < uVar35; uVar35 = uVar35 - 8) {
            *(char *)puVar34 = (char)uVar26;
            puVar34 = (ulong *)((long)puVar34 + 1);
            uVar26 = uVar26 >> 8;
          }
        }
        uVar25 = 0;
        do {
          uVar36 = *(uint *)((long)&c->o + uVar25 * 4 + 0xac);
          uVar30 = (ulong)(uVar36 & 0x1f);
          iVar22 = *(byte *)((long)&c->o + uVar30 + 0x98) + uVar35;
          uVar26 = (ulong)(uVar36 >> 5) << ((byte)iVar22 & 0x3f) |
                   (ulong)*(uint *)((long)&c->o + uVar30 * 4 + 0x4c) << ((byte)uVar35 & 0x3f) |
                   uVar26;
          uVar35 = (uint)""[uVar30] + iVar22;
          if (puVar34 < puVar2) {
            *puVar34 = uVar26;
            uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
            puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
            uVar35 = uVar35 & 7;
          }
          else {
            for (; 7 < uVar35; uVar35 = uVar35 - 8) {
              *(char *)puVar34 = (char)uVar26;
              puVar34 = (ulong *)((long)puVar34 + 1);
              uVar26 = uVar26 >> 8;
            }
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar23 + (uVar23 == 0));
      }
      lVar24 = 0;
      do {
        bVar21 = ""[lVar24 + 3];
        *(u32 *)((long)&c->o + lVar24 * 4 + 0xc) =
             ((int)lVar24 - deflate_length_slot_base[bVar21]) + 3 <<
             ((pdVar28->lens).offset[(ulong)bVar21 - 0x1f] & 0x1f) |
             (pdVar28->codewords).offset[(ulong)bVar21 - 0x1f];
        *(u8 *)((long)&c->o + lVar24 + 0x40f) =
             ""[bVar21] + (pdVar28->lens).offset[(ulong)bVar21 - 0x1f];
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x100);
      if (sequences == (deflate_sequence *)0x0) {
        puVar31 = (undefined1 *)((long)&c->p + 0x639584);
        do {
          uVar25 = (ulong)(*(uint *)(puVar31 + 4) & 0x1ff);
          uVar36 = *(uint *)(puVar31 + 4) >> 9;
          uVar30 = (ulong)uVar36;
          if (uVar25 == 1) {
            uVar26 = (ulong)(pdVar28->codewords).litlen[uVar30] << ((byte)uVar35 & 0x3f) | uVar26;
            uVar35 = (pdVar28->lens).litlen[uVar30] + uVar35;
            if (puVar34 < puVar2) {
LAB_00106865:
              *puVar34 = uVar26;
              uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
              puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
              uVar35 = uVar35 & 7;
            }
            else {
              for (; 7 < uVar35; uVar35 = uVar35 - 8) {
                *(char *)puVar34 = (char)uVar26;
                puVar34 = (ulong *)((long)puVar34 + 1);
                uVar26 = uVar26 >> 8;
              }
            }
          }
          else {
            bVar21 = *(byte *)((long)&c->p + uVar30 + 0x88e1dc);
            iVar22 = *(byte *)((long)&c->o + uVar25 + 0x40c) + uVar35;
            iVar37 = (uint)(pdVar28->lens).offset[bVar21] + iVar22;
            uVar26 = (ulong)(uVar36 - deflate_offset_slot_base[bVar21]) << ((byte)iVar37 & 0x3f) |
                     (ulong)(pdVar28->codewords).offset[bVar21] << ((byte)iVar22 & 0x3f) |
                     (ulong)*(uint *)((long)&c->o + uVar25 * 4) << ((byte)uVar35 & 0x3f) | uVar26;
            uVar35 = (uint)""[bVar21] + iVar37;
            if (puVar34 < puVar2) goto LAB_00106865;
            for (; 7 < uVar35; uVar35 = uVar35 - 8) {
              *(char *)puVar34 = (char)uVar26;
              puVar34 = (ulong *)((long)puVar34 + 1);
              uVar26 = uVar26 >> 8;
            }
          }
          puVar31 = puVar31 + uVar25 * 8;
        } while (puVar31 != (undefined1 *)((long)&c->p + (ulong)block_length * 8 + 0x639584));
      }
      else {
        while( true ) {
          uVar36 = sequences->litrunlen_and_length;
          for (uVar23 = uVar36 & 0x7fffff; 3 < uVar23; uVar23 = uVar23 - 4) {
            iVar37 = (pdVar28->lens).litlen[*block_begin] + uVar35;
            iVar22 = (uint)(pdVar28->lens).litlen[block_begin[1]] + iVar37;
            iVar38 = (uint)(pdVar28->lens).litlen[block_begin[2]] + iVar22;
            uVar26 = (ulong)(pdVar28->codewords).litlen[block_begin[3]] << ((byte)iVar38 & 0x3f) |
                     (ulong)(pdVar28->codewords).litlen[block_begin[2]] << ((byte)iVar22 & 0x3f) |
                     (ulong)(pdVar28->codewords).litlen[block_begin[1]] << ((byte)iVar37 & 0x3f) |
                     (ulong)(pdVar28->codewords).litlen[*block_begin] << ((byte)uVar35 & 0x3f) |
                     uVar26;
            uVar35 = (uint)(pdVar28->lens).litlen[block_begin[3]] + iVar38;
            if (puVar34 < puVar2) {
              *puVar34 = uVar26;
              uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
              puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
              uVar35 = uVar35 & 7;
            }
            else {
              for (; 7 < uVar35; uVar35 = uVar35 - 8) {
                *(char *)puVar34 = (char)uVar26;
                puVar34 = (ulong *)((long)puVar34 + 1);
                uVar26 = uVar26 >> 8;
              }
            }
            block_begin = block_begin + 4;
          }
          if (uVar23 != 0) {
            uVar26 = (ulong)(pdVar28->codewords).litlen[*block_begin] << ((byte)uVar35 & 0x3f) |
                     uVar26;
            uVar35 = (pdVar28->lens).litlen[*block_begin] + uVar35;
            if (uVar23 == 1) {
              block_begin = block_begin + 1;
            }
            else {
              uVar26 = uVar26 | (ulong)(pdVar28->codewords).litlen[block_begin[1]] <<
                                ((byte)uVar35 & 0x3f);
              uVar35 = uVar35 + (pdVar28->lens).litlen[block_begin[1]];
              if (uVar23 == 2) {
                block_begin = block_begin + 2;
              }
              else {
                pbVar1 = block_begin + 2;
                block_begin = block_begin + 3;
                uVar26 = uVar26 | (ulong)(pdVar28->codewords).litlen[*pbVar1] <<
                                  ((byte)uVar35 & 0x3f);
                uVar35 = uVar35 + (pdVar28->lens).litlen[*pbVar1];
              }
            }
            if (puVar34 < puVar2) {
              *puVar34 = uVar26;
              uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
              puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
              uVar35 = uVar35 & 7;
            }
            else {
              for (; 7 < uVar35; uVar35 = uVar35 - 8) {
                *(char *)puVar34 = (char)uVar26;
                puVar34 = (ulong *)((long)puVar34 + 1);
                uVar26 = uVar26 >> 8;
              }
            }
          }
          if (uVar36 < 0x800000) break;
          uVar25 = (ulong)(uVar36 >> 0x17);
          uVar4 = sequences->offset_slot;
          iVar37 = *(byte *)((long)&c->o + uVar25 + 0x40c) + uVar35;
          iVar22 = (uint)(pdVar28->lens).offset[uVar4] + iVar37;
          uVar26 = (ulong)((uint)sequences->offset - deflate_offset_slot_base[uVar4]) <<
                   ((byte)iVar22 & 0x3f) |
                   (ulong)(pdVar28->codewords).offset[uVar4] << ((byte)iVar37 & 0x3f) |
                   (ulong)*(uint *)((long)&c->o + uVar25 * 4) << ((byte)uVar35 & 0x3f) | uVar26;
          uVar35 = (uint)""[uVar4] + iVar22;
          if (puVar34 < puVar2) {
            *puVar34 = uVar26;
            uVar26 = uVar26 >> ((byte)uVar35 & 0x38);
            puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
            uVar35 = uVar35 & 7;
          }
          else {
            for (; 7 < uVar35; uVar35 = uVar35 - 8) {
              *(char *)puVar34 = (char)uVar26;
              puVar34 = (ulong *)((long)puVar34 + 1);
              uVar26 = uVar26 >> 8;
            }
          }
          block_begin = block_begin + uVar25;
          sequences = sequences + 1;
        }
      }
      uVar25 = (ulong)(pdVar28->codewords).litlen[0x100] << ((byte)uVar35 & 0x3f) | uVar26;
      uVar35 = (pdVar28->lens).litlen[0x100] + uVar35;
      if (puVar34 < puVar2) {
        *puVar34 = uVar25;
        uVar25 = uVar25 >> ((byte)uVar35 & 0x38);
        puVar34 = (ulong *)((long)puVar34 + (ulong)(uVar35 >> 3));
        uVar35 = uVar35 & 7;
      }
      else {
        for (; 7 < uVar35; uVar35 = uVar35 - 8) {
          *(char *)puVar34 = (char)uVar25;
          puVar34 = (ulong *)((long)puVar34 + 1);
          uVar25 = uVar25 >> 8;
        }
      }
    }
    os->bitbuf = uVar25;
    os->bitcount = uVar35;
    os->next = (u8 *)puVar34;
  }
  return;
}

Assistant:

void
deflate_flush_block(struct libdeflate_compressor *c,
		    struct deflate_output_bitstream *os,
		    const u8 *block_begin, u32 block_length,
		    const struct deflate_sequence *sequences,
		    bool is_final_block)
{
	/*
	 * It is hard to get compilers to understand that writes to 'os->next'
	 * don't alias 'os'.  That hurts performance significantly, as
	 * everything in 'os' would keep getting re-loaded.  ('restrict'
	 * *should* do the trick, but it's unreliable.)  Therefore, we keep all
	 * the output bitstream state in local variables, and output bits using
	 * macros.  This is similar to what the decompressor does.
	 */
	const u8 *in_next = block_begin;
	const u8 * const in_end = block_begin + block_length;
	bitbuf_t bitbuf = os->bitbuf;
	unsigned bitcount = os->bitcount;
	u8 *out_next = os->next;
	u8 * const out_fast_end =
		os->end - MIN(WORDBYTES - 1, os->end - out_next);
	/*
	 * The cost for each block type, in bits.  Start with the cost of the
	 * block header which is 3 bits.
	 */
	u32 dynamic_cost = 3;
	u32 static_cost = 3;
	u32 uncompressed_cost = 3;
	u32 best_cost;
	struct deflate_codes *codes;
	unsigned sym;

	ASSERT(block_length >= MIN_BLOCK_LENGTH ||
	       (is_final_block && block_length > 0));
	ASSERT(block_length <= MAX_BLOCK_LENGTH);
	ASSERT(bitcount <= 7);
	ASSERT((bitbuf & ~(((bitbuf_t)1 << bitcount) - 1)) == 0);
	ASSERT(out_next <= os->end);
	ASSERT(!os->overflow);

	/* Precompute the precode items and build the precode. */
	deflate_precompute_huffman_header(c);

	/* Account for the cost of encoding dynamic Huffman codes. */
	dynamic_cost += 5 + 5 + 4 + (3 * c->o.precode.num_explicit_lens);
	for (sym = 0; sym < DEFLATE_NUM_PRECODE_SYMS; sym++) {
		u32 extra = deflate_extra_precode_bits[sym];

		dynamic_cost += c->o.precode.freqs[sym] *
				(extra + c->o.precode.lens[sym]);
	}

	/* Account for the cost of encoding literals. */
	for (sym = 0; sym < 144; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 8;
	}
	for (; sym < 256; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 9;
	}

	/* Account for the cost of encoding the end-of-block symbol. */
	dynamic_cost += c->codes.lens.litlen[DEFLATE_END_OF_BLOCK];
	static_cost += 7;

	/* Account for the cost of encoding lengths. */
	for (sym = DEFLATE_FIRST_LEN_SYM;
	     sym < DEFLATE_FIRST_LEN_SYM + ARRAY_LEN(deflate_extra_length_bits);
	     sym++) {
		u32 extra = deflate_extra_length_bits[
					sym - DEFLATE_FIRST_LEN_SYM];

		dynamic_cost += c->freqs.litlen[sym] *
				(extra + c->codes.lens.litlen[sym]);
		static_cost += c->freqs.litlen[sym] *
				(extra + c->static_codes.lens.litlen[sym]);
	}

	/* Account for the cost of encoding offsets. */
	for (sym = 0; sym < ARRAY_LEN(deflate_extra_offset_bits); sym++) {
		u32 extra = deflate_extra_offset_bits[sym];

		dynamic_cost += c->freqs.offset[sym] *
				(extra + c->codes.lens.offset[sym]);
		static_cost += c->freqs.offset[sym] * (extra + 5);
	}

	/* Compute the cost of using uncompressed blocks. */
	uncompressed_cost += (-(bitcount + 3) & 7) + 32 +
			     (40 * (DIV_ROUND_UP(block_length,
						 UINT16_MAX) - 1)) +
			     (8 * block_length);

	/*
	 * Choose and output the cheapest type of block.  If there is a tie,
	 * prefer uncompressed, then static, then dynamic.
	 */

	best_cost = MIN(dynamic_cost, MIN(static_cost, uncompressed_cost));

	/* If the block isn't going to fit, then stop early. */
	if (DIV_ROUND_UP(bitcount + best_cost, 8) > os->end - out_next) {
		os->overflow = true;
		return;
	}
	/*
	 * Else, now we know that the block fits, so no further bounds checks on
	 * the output buffer are required until the next block.
	 */

	if (best_cost == uncompressed_cost) {
		/*
		 * Uncompressed block(s).  DEFLATE limits the length of
		 * uncompressed blocks to UINT16_MAX bytes, so if the length of
		 * the "block" we're flushing is over UINT16_MAX, we actually
		 * output multiple blocks.
		 */
		do {
			u8 bfinal = 0;
			size_t len = UINT16_MAX;

			if (in_end - in_next <= UINT16_MAX) {
				bfinal = is_final_block;
				len = in_end - in_next;
			}
			/* It was already checked that there is enough space. */
			ASSERT(os->end - out_next >=
			       DIV_ROUND_UP(bitcount + 3, 8) + 4 + len);
			/*
			 * Output BFINAL (1 bit) and BTYPE (2 bits), then align
			 * to a byte boundary.
			 */
			STATIC_ASSERT(DEFLATE_BLOCKTYPE_UNCOMPRESSED == 0);
			*out_next++ = (bfinal << bitcount) | bitbuf;
			if (bitcount > 5)
				*out_next++ = 0;
			bitbuf = 0;
			bitcount = 0;
			/* Output LEN and NLEN, then the data itself. */
			put_unaligned_le16(len, out_next);
			out_next += 2;
			put_unaligned_le16(~len, out_next);
			out_next += 2;
			memcpy(out_next, in_next, len);
			out_next += len;
			in_next += len;
		} while (in_next != in_end);
		/* Done outputting uncompressed block(s) */
		goto out;
	}

	if (best_cost == static_cost) {
		/* Static Huffman block */
		codes = &c->static_codes;
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_STATIC_HUFFMAN, 2);
		FLUSH_BITS();
	} else {
		const unsigned num_explicit_lens = c->o.precode.num_explicit_lens;
		const unsigned num_precode_items = c->o.precode.num_items;
		unsigned precode_sym, precode_item;
		unsigned i;

		/* Dynamic Huffman block */

		codes = &c->codes;
		STATIC_ASSERT(CAN_BUFFER(1 + 2 + 5 + 5 + 4 + 3));
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN, 2);
		ADD_BITS(c->o.precode.num_litlen_syms - 257, 5);
		ADD_BITS(c->o.precode.num_offset_syms - 1, 5);
		ADD_BITS(num_explicit_lens - 4, 4);

		/* Output the lengths of the codewords in the precode. */
		if (CAN_BUFFER(3 * (DEFLATE_NUM_PRECODE_SYMS - 1))) {
			/*
			 * A 64-bit bitbuffer is just one bit too small to hold
			 * the maximum number of precode lens, so to minimize
			 * flushes we merge one len with the previous fields.
			 */
			precode_sym = deflate_precode_lens_permutation[0];
			ADD_BITS(c->o.precode.lens[precode_sym], 3);
			FLUSH_BITS();
			i = 1; /* num_explicit_lens >= 4 */
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
			} while (++i < num_explicit_lens);
			FLUSH_BITS();
		} else {
			FLUSH_BITS();
			i = 0;
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
				FLUSH_BITS();
			} while (++i < num_explicit_lens);
		}

		/*
		 * Output the lengths of the codewords in the litlen and offset
		 * codes, encoded by the precode.
		 */
		i = 0;
		do {
			precode_item = c->o.precode.items[i];
			precode_sym = precode_item & 0x1F;
			STATIC_ASSERT(CAN_BUFFER(MAX_PRE_CODEWORD_LEN + 7));
			ADD_BITS(c->o.precode.codewords[precode_sym],
				 c->o.precode.lens[precode_sym]);
			ADD_BITS(precode_item >> 5,
				 deflate_extra_precode_bits[precode_sym]);
			FLUSH_BITS();
		} while (++i < num_precode_items);
	}

	/* Output the literals and matches for a dynamic or static block. */
	ASSERT(bitcount <= 7);
	deflate_compute_full_len_codewords(c, codes);
#if SUPPORT_NEAR_OPTIMAL_PARSING
	if (sequences == NULL) {
		/* Output the literals and matches from the minimum-cost path */
		struct deflate_optimum_node *cur_node =
			&c->p.n.optimum_nodes[0];
		struct deflate_optimum_node * const end_node =
			&c->p.n.optimum_nodes[block_length];
		do {
			u32 length = cur_node->item & OPTIMUM_LEN_MASK;
			u32 offset = cur_node->item >> OPTIMUM_OFFSET_SHIFT;

			if (length == 1) {
				/* Literal */
				ADD_BITS(codes->codewords.litlen[offset],
					 codes->lens.litlen[offset]);
				FLUSH_BITS();
			} else {
				/* Match */
				WRITE_MATCH(c, codes, length, offset,
					    c->p.n.offset_slot_full[offset]);
			}
			cur_node += length;
		} while (cur_node != end_node);
	} else
#endif /* SUPPORT_NEAR_OPTIMAL_PARSING */
	{
		/* Output the literals and matches from the sequences list. */
		const struct deflate_sequence *seq;

		for (seq = sequences; ; seq++) {
			u32 litrunlen = seq->litrunlen_and_length &
					SEQ_LITRUNLEN_MASK;
			u32 length = seq->litrunlen_and_length >>
				     SEQ_LENGTH_SHIFT;
			unsigned lit;

			/* Output a run of literals. */
			if (CAN_BUFFER(4 * MAX_LITLEN_CODEWORD_LEN)) {
				for (; litrunlen >= 4; litrunlen -= 4) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
				if (litrunlen-- != 0) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					if (litrunlen-- != 0) {
						lit = *in_next++;
						ADD_BITS(codes->codewords.litlen[lit],
							 codes->lens.litlen[lit]);
						if (litrunlen-- != 0) {
							lit = *in_next++;
							ADD_BITS(codes->codewords.litlen[lit],
								 codes->lens.litlen[lit]);
						}
					}
					FLUSH_BITS();
				}
			} else {
				while (litrunlen--) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
			}

			if (length == 0) { /* Last sequence? */
				ASSERT(in_next == in_end);
				break;
			}

			/* Output a match. */
			WRITE_MATCH(c, codes, length, seq->offset,
				    seq->offset_slot);
			in_next += length;
		}
	}

	/* Output the end-of-block symbol. */
	ASSERT(bitcount <= 7);
	ADD_BITS(codes->codewords.litlen[DEFLATE_END_OF_BLOCK],
		 codes->lens.litlen[DEFLATE_END_OF_BLOCK]);
	FLUSH_BITS();
out:
	ASSERT(bitcount <= 7);
	/*
	 * Assert that the block cost was computed correctly.  This is relied on
	 * above for the bounds check on the output buffer.  Also,
	 * libdeflate_deflate_compress_bound() relies on this via the assumption
	 * that uncompressed blocks will always be used when cheapest.
	 */
	ASSERT(8 * (out_next - os->next) + bitcount - os->bitcount == best_cost);
	os->bitbuf = bitbuf;
	os->bitcount = bitcount;
	os->next = out_next;
}